

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O2

void pzshape::TPZShapeCube::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  int b;
  int iVar6;
  int c;
  int iVar7;
  int iVar8;
  int node;
  long lVar9;
  int a;
  int iVar10;
  ulong uVar11;
  TPZGenMatrix<int> locshapeorders;
  TPZManVector<long,_4> locid;
  TPZStack<int,_10> lowersides;
  
  if (side < 8) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x17b);
    }
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar3 = 1;
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar3 = 0;
    piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar3 = 0;
  }
  else if (side == 0x1a) {
    iVar7 = order + -1;
    if (shapeorders->fRows != (long)(iVar7 * iVar7 * iVar7)) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x185);
    }
    iVar5 = 0;
    for (iVar10 = 2; iVar10 <= order; iVar10 = iVar10 + 1) {
      iVar1 = iVar5;
      for (iVar6 = 2; iVar5 = iVar7 + iVar5, iVar6 != order + 1; iVar6 = iVar6 + 1) {
        iVar8 = 2;
        for (lVar9 = (long)iVar1; iVar5 != lVar9; lVar9 = lVar9 + 1) {
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,0);
          *piVar3 = iVar10;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,1);
          *piVar3 = iVar6;
          piVar3 = TPZGenMatrix<int>::operator()(shapeorders,lVar9,2);
          *piVar3 = iVar8;
          iVar8 = iVar8 + 1;
        }
        iVar1 = iVar7 + iVar1;
      }
      iVar5 = iVar1;
    }
  }
  else if ((uint)side < 0x14) {
    uVar2 = order - 1;
    if (shapeorders->fRows != (long)(int)uVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x19d);
    }
    uVar11 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar11;
    }
    for (; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar11,0);
      *piVar3 = (int)uVar11 + 2;
    }
  }
  else {
    uVar4 = (ulong)(uint)((order + -1) * (order + -1));
    if (shapeorders->fRows != uVar4) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapecube.cpp"
                 ,0x1a9);
    }
    TPZStack<int,_10>::TPZStack(&lowersides);
    pztopology::TPZCube::LowerDimensionSides(side,&lowersides);
    TPZStack<int,_10>::Push(&lowersides,side);
    iVar7 = pztopology::TPZCube::NSideNodes(side);
    TPZManVector<long,_4>::TPZManVector(&locid,(long)iVar7);
    for (lVar9 = 0; lVar9 < locid.super_TPZVec<long>.fNElements; lVar9 = lVar9 + 1) {
      iVar7 = pztopology::TPZCube::ContainedSideLocId(side,(int)lVar9);
      locid.super_TPZVec<long>.fStore[lVar9] = id->fStore[iVar7];
    }
    TPZGenMatrix<int>::TPZGenMatrix(&locshapeorders,uVar4,3);
    TPZShapeQuad::SideShapeOrder(8,&locid.super_TPZVec<long>,order,&locshapeorders);
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      piVar3 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar11,0);
      iVar7 = *piVar3;
      piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar11,0);
      *piVar3 = iVar7;
      piVar3 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar11,1);
      iVar7 = *piVar3;
      piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar11,1);
      *piVar3 = iVar7;
      piVar3 = TPZGenMatrix<int>::operator()(&locshapeorders,uVar11,2);
      iVar7 = *piVar3;
      piVar3 = TPZGenMatrix<int>::operator()(shapeorders,uVar11,2);
      *piVar3 = iVar7;
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&locshapeorders);
    TPZManVector<long,_4>::~TPZManVector(&locid);
    TPZManVector<int,_10>::~TPZManVector(&lowersides.super_TPZManVector<int,_10>);
  }
  return;
}

Assistant:

void TPZShapeCube::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=7)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side == 26)
        {
            int nsei = (order-1)*(order-1)*(order-1);
            if (shapeorders.Rows() != nsei) {
                DebugStop();
            }
            int count = 0;
            for (int i=2; i<order+1; i++) {
                for (int j=2; j<order+1; j++) {
                    for (int k=2; k<order+1; k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        shapeorders(count,0) = a;
                        shapeorders(count,1) = b;
                        shapeorders(count,2) = c;
                        count++;

                    }
                    
                }
            }
        }
        else if (side>7 && side<20)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else
        {

            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo? 
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);

            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
           
        }

    }